

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile
          (FileGenerator *this,FileDescriptor *file,CrossFileReferences *refs)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  FileDescriptor *local_40;
  FileDescriptor *dep;
  undefined1 auStack_30 [4];
  int i;
  CrossFileReferences *local_28;
  CrossFileReferences *local_20;
  CrossFileReferences *refs_local;
  FileDescriptor *file_local;
  FileGenerator *this_local;
  
  _auStack_30 = this;
  local_28 = refs;
  local_20 = refs;
  refs_local = (CrossFileReferences *)file;
  file_local = (FileDescriptor *)this;
  ForEachField<google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
            (file,(anon_class_16_2_3fe543fb *)auStack_30);
  bVar2 = HasDescriptorMethods((FileDescriptor *)refs_local,&this->options_);
  if (bVar2) {
    for (dep._4_4_ = 0; iVar1 = dep._4_4_,
        iVar3 = FileDescriptor::dependency_count((FileDescriptor *)refs_local), iVar1 < iVar3;
        dep._4_4_ = dep._4_4_ + 1) {
      local_40 = FileDescriptor::dependency((FileDescriptor *)refs_local,dep._4_4_);
      bVar2 = IsDepWeak(this,local_40);
      if (bVar2) {
        std::
        unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::insert(&local_20->weak_reflection_files,&local_40);
      }
      else {
        std::
        unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::insert(&local_20->strong_reflection_files,&local_40);
      }
    }
  }
  return;
}

Assistant:

void FileGenerator::GetCrossFileReferencesForFile(const FileDescriptor* file,
                                                  CrossFileReferences* refs) {
  ForEachField(file, [this, refs](const FieldDescriptor* field) {
    GetCrossFileReferencesForField(field, refs);
  });

  if (!HasDescriptorMethods(file, options_)) return;

  for (int i = 0; i < file->dependency_count(); i++) {
    const FileDescriptor* dep = file->dependency(i);
    if (IsDepWeak(dep)) {
      refs->weak_reflection_files.insert(dep);
    } else {
      refs->strong_reflection_files.insert(dep);
    }
  }
}